

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O0

int pkey_rsa_init(EVP_PKEY_CTX *ctx)

{
  undefined4 *puVar1;
  RSA_PKEY_CTX *rctx;
  EVP_PKEY_CTX *ctx_local;
  
  puVar1 = (undefined4 *)OPENSSL_zalloc(0x48);
  if (puVar1 != (undefined4 *)0x0) {
    *puVar1 = 0x800;
    puVar1[4] = 1;
    puVar1[10] = 0xfffffffe;
    ctx->data = puVar1;
  }
  ctx_local._4_4_ = (uint)(puVar1 != (undefined4 *)0x0);
  return ctx_local._4_4_;
}

Assistant:

static int pkey_rsa_init(EVP_PKEY_CTX *ctx) {
  RSA_PKEY_CTX *rctx =
      reinterpret_cast<RSA_PKEY_CTX *>(OPENSSL_zalloc(sizeof(RSA_PKEY_CTX)));
  if (!rctx) {
    return 0;
  }

  rctx->nbits = 2048;
  rctx->pad_mode = RSA_PKCS1_PADDING;
  rctx->saltlen = -2;

  ctx->data = rctx;

  return 1;
}